

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::UnpackSnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackSnorm4x8CaseInstance *this)

{
  ostringstream *poVar1;
  ShaderExecutor *pSVar2;
  TestStatus *pTVar3;
  deUint32 dVar4;
  ostream *poVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auVar12 [12];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  deUint32 u32_1;
  deUint32 u32_3;
  deUint32 u32_5;
  deUint32 u32_7;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  void *in;
  deUint32 u32;
  deUint32 u32_2;
  deUint32 u32_4;
  deUint32 u32_6;
  Random rnd;
  Hex<8UL> local_2a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  UnpackSnorm4x8CaseInstance *local_280;
  uint local_274;
  uint local_270;
  uint local_26c;
  long local_268;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_238;
  ulong local_220;
  TestStatus *local_218;
  ulong local_210;
  undefined1 local_208 [16];
  TestLog local_1f8 [13];
  ios_base local_190 [264];
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  deRandom local_40;
  
  local_280 = this;
  dVar4 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar4 ^ 0x776002);
  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_238.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_298,(iterator)0x0,(uint *)local_208);
  local_208._0_4_ = 0x7fff8000;
  if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_298,
               (iterator)
               local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_208);
  }
  else {
    *local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_208._0_4_ = 0x80007fff;
  if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_298,
               (iterator)
               local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_208);
  }
  else {
    *local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_208._0_4_ = 0xffffffff;
  if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_298,
               (iterator)
               local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_208);
  }
  else {
    *local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_208._0_4_ = 0x1fffe;
  local_218 = __return_storage_ptr__;
  if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_298,
               (iterator)
               local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_208);
  }
  else {
    *local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar9 = 0x5f;
  do {
    dVar4 = deRandom_getUint32(&local_40);
    local_208._0_4_ = dVar4;
    if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_298,
                 (iterator)
                 local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_208);
    }
    else {
      *local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar4;
      local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&local_238,
             (long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_208._0_8_ = ((local_280->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_208 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_190);
  local_208._0_8_ =
       local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_2a0.value =
       (deUint64)
       local_238.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (local_280->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar2->_vptr_ShaderExecutor[2])
            (pSVar2,(ulong)((long)local_298.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_298.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_208,&local_2a0
             ,0);
  local_220 = (ulong)((long)local_298.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar10 = 0;
  if (0 < (int)local_220) {
    lVar7 = 0;
    lVar8 = 0xc;
    uVar10 = 0;
    do {
      uVar11 = *(pointer)((long)(qpTestLog **)
                                local_298.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar7 * 4);
      fVar13 = (float)((int)uVar11 >> 0x18) / 127.0;
      auVar12 = ZEXT812(0x3f800000);
      if (fVar13 <= 1.0) {
        auVar12._4_8_ = 0;
        auVar12._0_4_ = fVar13;
      }
      uStack_84 = 0;
      uStack_80 = auVar12._8_4_;
      local_88 = (float)(-(uint)(fVar13 < -1.0) & 0xbf800000 |
                        ~-(uint)(fVar13 < -1.0) & auVar12._0_4_);
      local_24c = *(float *)((long)(local_238.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8);
      uStack_7c = 0;
      local_274 = (int)local_24c - (int)local_88;
      if ((uint)local_24c < (uint)local_88) {
        local_274 = -((int)local_24c - (int)local_88);
      }
      fVar14 = (float)(int)(char)(uVar11 >> 0x10) / 127.0;
      fVar13 = 1.0;
      if (fVar14 <= 1.0) {
        fVar13 = fVar14;
      }
      uStack_74 = 0;
      fVar13 = (float)(-(uint)(fVar14 < -1.0) & 0xbf800000 | ~-(uint)(fVar14 < -1.0) & (uint)fVar13)
      ;
      local_248 = *(float *)((long)(local_238.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8 + -4)
      ;
      uStack_70 = 0;
      uStack_6c = 0;
      local_270 = (int)local_248 - (int)fVar13;
      if ((uint)local_248 < (uint)fVar13) {
        local_270 = -((int)local_248 - (int)fVar13);
      }
      fVar15 = (float)(int)(char)(uVar11 >> 8) / 127.0;
      fVar14 = 1.0;
      if (fVar15 <= 1.0) {
        fVar14 = fVar15;
      }
      fVar15 = (float)(-(uint)(fVar15 < -1.0) & 0xbf800000 | ~-(uint)(fVar15 < -1.0) & (uint)fVar14)
      ;
      local_240 = *(float *)((long)(local_238.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data +
                            lVar8 + -0xc);
      local_244 = *(float *)((long)(local_238.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8 + -8)
      ;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      fVar16 = (float)(int)(char)uVar11 / 127.0;
      fVar14 = 1.0;
      if (fVar16 <= 1.0) {
        fVar14 = fVar16;
      }
      uStack_54 = 0;
      fVar14 = (float)(-(uint)(fVar16 < -1.0) & 0xbf800000 | ~-(uint)(fVar16 < -1.0) & (uint)fVar14)
      ;
      uStack_50 = 0;
      uStack_4c = 0;
      local_26c = (int)local_244 - (int)fVar15;
      if ((uint)local_244 < (uint)fVar15) {
        local_26c = -((int)local_244 - (int)fVar15);
      }
      uVar11 = (int)local_240 - (int)fVar14;
      if ((uint)local_240 < (uint)fVar14) {
        uVar11 = -((int)local_240 - (int)fVar14);
      }
      local_268 = lVar7;
      local_23c = local_240;
      local_78 = fVar13;
      local_68 = fVar15;
      local_58 = fVar14;
      if (((1 < uVar11) || (1 < local_26c)) || (1 < (local_270 | local_274))) {
        if ((int)uVar10 < 10) {
          local_208._0_8_ = ((local_280->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_208 + 8);
          local_25c = local_24c;
          local_258 = local_248;
          local_254 = local_244;
          local_250 = local_88;
          local_210 = uVar10;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"  expected unpackSnorm4x8(",0x1a);
          local_2a0.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_298.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_268 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_2a0,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"vec4(",5);
          poVar5 = std::ostream::_M_insert<double>((double)local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_2a0.value = (deUint64)(uint)fVar14;
          tcu::Format::Hex<8UL>::toStream(&local_2a0,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_208 + 8),", ",2);
          poVar5 = (ostream *)(local_208 + 8);
          poVar6 = std::ostream::_M_insert<double>((double)local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_2a0.value = (deUint64)(uint)fVar15;
          tcu::Format::Hex<8UL>::toStream(&local_2a0,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_2a0.value = (deUint64)(uint)fVar13;
          tcu::Format::Hex<8UL>::toStream(&local_2a0,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_88);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_2a0.value = (deUint64)(uint)local_250;
          tcu::Format::Hex<8UL>::toStream(&local_2a0,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got vec4(",0xb);
          poVar6 = std::ostream::_M_insert<double>((double)local_23c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_2a0.value = (deUint64)(uint)local_240;
          tcu::Format::Hex<8UL>::toStream(&local_2a0,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_244);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_2a0.value = (deUint64)(uint)local_254;
          tcu::Format::Hex<8UL>::toStream(&local_2a0,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_248);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_2a0.value = (deUint64)(uint)local_258;
          tcu::Format::Hex<8UL>::toStream(&local_2a0,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_24c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_2a0.value = (deUint64)(uint)local_25c;
          tcu::Format::Hex<8UL>::toStream(&local_2a0,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), max diff = ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar5);
          std::ios_base::~ios_base(local_190);
          uVar10 = local_210;
        }
        else if ((int)uVar10 == 10) {
          local_208._0_8_ = ((local_280->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_208 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_208 + 8));
          std::ios_base::~ios_base(local_190);
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      lVar7 = local_268 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 < (int)((ulong)((long)local_298.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_298.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  local_208._0_8_ = ((local_280->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_208 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,(int)local_220 - (int)uVar10);
  pTVar3 = local_218;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,(int)local_220);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_190);
  local_208._0_8_ = local_1f8;
  if ((int)uVar10 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"Pass","");
    pTVar3->m_code = QP_TEST_RESULT_PASS;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,local_208._0_8_,
               (long)(qpTestLog **)local_208._0_8_ + local_208._8_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,"Result comparison failed","");
    pTVar3->m_code = QP_TEST_RESULT_FAIL;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,local_208._0_8_,
               (long)(qpTestLog **)local_208._0_8_ + local_208._8_8_);
  }
  if ((TestLog *)local_208._0_8_ != local_1f8) {
    operator_delete((void *)local_208._0_8_,(ulong)((long)&(local_1f8[0].m_log)->flags + 1));
  }
  if (local_238.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((TestLog *)
      local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deInt8	in0		= (deInt8)(deUint8)(inputs[valNdx] & 0xff);
				const deInt8	in1		= (deInt8)(deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deInt8	in2		= (deInt8)(deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deInt8	in3		= (deInt8)(deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 127.f, -1.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 127.f, -1.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 127.f, -1.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 127.f, -1.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackSnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}